

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
wasm::Builder::makeFunction
          (Name name,HeapType type,vector<wasm::Type,_std::allocator<wasm::Type>_> *vars,
          Expression *body)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  undefined8 uVar4;
  uintptr_t uVar5;
  int iVar6;
  undefined8 *__s;
  undefined8 in_R9;
  HeapType type_local;
  
  iVar6 = ::wasm::HeapType::getKind();
  if (iVar6 == 1) {
    __s = (undefined8 *)operator_new(0x1d8);
    memset(__s,0,0x1d8);
    ::wasm::HeapType::HeapType((HeapType *)(__s + 7),(Signature)ZEXT816(0));
    *(undefined4 *)(__s + 8) = 0;
    __s[9] = 0;
    __s[10] = 0;
    __s[0xb] = 0;
    __s[0xc] = 0;
    __s[0xd] = __s + 0x13;
    __s[0xe] = 1;
    __s[0xf] = 0;
    __s[0x10] = 0;
    *(undefined4 *)(__s + 0x11) = 0x3f800000;
    __s[0x12] = 0;
    __s[0x13] = 0;
    __s[0x14] = __s + 0x1a;
    __s[0x15] = 1;
    __s[0x16] = 0;
    __s[0x17] = 0;
    *(undefined4 *)(__s + 0x18) = 0x3f800000;
    __s[0x19] = 0;
    __s[0x1a] = 0;
    __s[0x1b] = __s + 0x21;
    __s[0x1c] = 1;
    __s[0x1d] = 0;
    __s[0x1e] = 0;
    *(undefined4 *)(__s + 0x1f) = 0x3f800000;
    __s[0x20] = 0;
    __s[0x21] = 0;
    *(undefined1 *)((long)__s + 0x124) = 0;
    *(undefined1 *)((long)__s + 0x13c) = 0;
    __s[0x28] = __s + 0x2e;
    __s[0x29] = 1;
    __s[0x2a] = 0;
    __s[0x2b] = 0;
    *(undefined4 *)(__s + 0x2c) = 0x3f800000;
    __s[0x2d] = 0;
    __s[0x2e] = 0;
    __s[0x2f] = __s + 0x35;
    __s[0x30] = 1;
    __s[0x31] = 0;
    __s[0x32] = 0;
    *(undefined4 *)(__s + 0x33) = 0x3f800000;
    *(undefined8 *)((long)__s + 0x1ac) = 0;
    *(undefined8 *)((long)__s + 0x1b4) = 0;
    __s[0x34] = 0;
    __s[0x35] = 0;
    __s[0x38] = 0;
    __s[0x39] = 0;
    *(undefined2 *)(__s + 0x3a) = 0;
    *(undefined8 **)name.super_IString.str._M_len = __s;
    *__s = name.super_IString.str._M_str;
    __s[1] = type.id;
    __s[7] = vars;
    __s[0xc] = in_R9;
    uVar1 = __s[0xb];
    uVar2 = *(undefined8 *)body;
    uVar3 = (body->type).id;
    __s[0xb] = *(undefined8 *)(body + 1);
    uVar4 = __s[9];
    uVar5 = __s[10];
    __s[9] = uVar2;
    __s[10] = uVar3;
    *(undefined8 *)body = uVar4;
    (body->type).id = uVar5;
    *(undefined8 *)(body + 1) = uVar1;
    return (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
           name.super_IString.str._M_len;
  }
  __assert_fail("type.isSignature()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x32,
                "static std::unique_ptr<Function> wasm::Builder::makeFunction(Name, HeapType, std::vector<Type> &&, Expression *)"
               );
}

Assistant:

static std::unique_ptr<Function> makeFunction(Name name,
                                                HeapType type,
                                                std::vector<Type>&& vars,
                                                Expression* body = nullptr) {
    assert(type.isSignature());
    auto func = std::make_unique<Function>();
    func->name = name;
    func->type = type;
    func->body = body;
    func->vars.swap(vars);
    return func;
  }